

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PipelineResourceSignatureBase.hpp
# Opt level: O0

void __thiscall
Diligent::PipelineResourceSignatureBase<Diligent::EngineVkImplTraits>::PipelineResourceSignatureBase
          (PipelineResourceSignatureBase<Diligent::EngineVkImplTraits> *this,
          IReferenceCounters *pRefCounters,RenderDeviceImplType *pDevice,
          PipelineResourceSignatureDesc *Desc,SHADER_TYPE ShaderStages,bool bIsDeviceInternal)

{
  SHADER_TYPE SVar1;
  PIPELINE_TYPE PVar2;
  value_type_conflict3 vVar3;
  SHADER_TYPE SVar4;
  IMemoryAllocator *RawMemAllocator;
  Char *pCVar5;
  reference pvVar6;
  undefined1 local_98 [8];
  string msg_1;
  Int32 ShaderTypeInd;
  SHADER_TYPE StageBit;
  SHADER_TYPE StaticResStages;
  Uint32 StaticVarStageIdx;
  string msg;
  PipelineResourceDesc *ResDesc;
  Uint32 i;
  bool bIsDeviceInternal_local;
  SHADER_TYPE ShaderStages_local;
  PipelineResourceSignatureDesc *Desc_local;
  RenderDeviceImplType *pDevice_local;
  IReferenceCounters *pRefCounters_local;
  PipelineResourceSignatureBase<Diligent::EngineVkImplTraits> *this_local;
  
  DeviceObjectBase<Diligent::IPipelineResourceSignature,_Diligent::RenderDeviceVkImpl,_Diligent::PipelineResourceSignatureDesc>
  ::DeviceObjectBase(&this->
                      super_DeviceObjectBase<Diligent::IPipelineResourceSignature,_Diligent::RenderDeviceVkImpl,_Diligent::PipelineResourceSignatureDesc>
                     ,pRefCounters,pDevice,Desc,bIsDeviceInternal);
  (this->
  super_DeviceObjectBase<Diligent::IPipelineResourceSignature,_Diligent::RenderDeviceVkImpl,_Diligent::PipelineResourceSignatureDesc>
  ).super_ObjectBase<Diligent::IPipelineResourceSignature>.
  super_RefCountedObject<Diligent::IPipelineResourceSignature>.super_IPipelineResourceSignature.
  super_IDeviceObject.super_IObject._vptr_IObject = (_func_int **)&PTR_QueryInterface_010d2160;
  std::unique_ptr<void,Diligent::STDDeleter<void,Diligent::IMemoryAllocator>>::
  unique_ptr<Diligent::STDDeleter<void,Diligent::IMemoryAllocator>,void>
            ((unique_ptr<void,Diligent::STDDeleter<void,Diligent::IMemoryAllocator>> *)
             &this->m_pRawMemory);
  this->m_pResourceAttribs = (PipelineResourceAttribsType *)0x0;
  this->m_pImmutableSamplerAttribs = (ImmutableSamplerAttribsType *)0x0;
  this->m_pImmutableSamplers = (RefCntAutoPtr<Diligent::SamplerVkImpl> *)0x0;
  this->m_pStaticResCache = (ShaderResourceCacheImplType *)0x0;
  this->m_StaticVarsMgrs = (ShaderVariableManagerImplType *)0x0;
  this->m_Hash = 0;
  *(undefined8 *)(this->m_ResourceOffsets)._M_elems = 0;
  this->m_ShaderStages = ShaderStages;
  this->m_StaticResShaderStages = SHADER_TYPE_UNKNOWN;
  this->m_PipelineType = PIPELINE_TYPE_INVALID;
  (this->m_StaticResStageIndex)._M_elems[0] = -1;
  (this->m_StaticResStageIndex)._M_elems[1] = -1;
  (this->m_StaticResStageIndex)._M_elems[2] = -1;
  (this->m_StaticResStageIndex)._M_elems[3] = -1;
  (this->m_StaticResStageIndex)._M_elems[4] = -1;
  (this->m_StaticResStageIndex)._M_elems[5] = -1;
  RawMemAllocator = GetRawAllocator();
  SRBMemoryAllocator::SRBMemoryAllocator(&this->m_SRBMemAllocator,RawMemAllocator);
  this->m_IsDestructed = false;
  (this->
  super_DeviceObjectBase<Diligent::IPipelineResourceSignature,_Diligent::RenderDeviceVkImpl,_Diligent::PipelineResourceSignatureDesc>
  ).m_Desc.Resources = (PipelineResourceDesc *)0x0;
  (this->
  super_DeviceObjectBase<Diligent::IPipelineResourceSignature,_Diligent::RenderDeviceVkImpl,_Diligent::PipelineResourceSignatureDesc>
  ).m_Desc.ImmutableSamplers = (ImmutableSamplerDesc *)0x0;
  (this->
  super_DeviceObjectBase<Diligent::IPipelineResourceSignature,_Diligent::RenderDeviceVkImpl,_Diligent::PipelineResourceSignatureDesc>
  ).m_Desc.CombinedSamplerSuffix = (Char *)0x0;
  ValidatePipelineResourceSignatureDesc(Desc,(IRenderDevice *)pDevice,RENDER_DEVICE_TYPE_VULKAN);
  for (ResDesc._0_4_ = 0; (uint)ResDesc < Desc->NumResources; ResDesc._0_4_ = (uint)ResDesc + 1) {
    msg.field_2._8_8_ = Desc->Resources + (uint)ResDesc;
    Diligent::operator|=
              (&this->m_ShaderStages,((PipelineResourceDesc *)msg.field_2._8_8_)->ShaderStages);
    if (*(char *)(msg.field_2._8_8_ + 0x11) == '\0') {
      Diligent::operator|=(&this->m_StaticResShaderStages,*(SHADER_TYPE *)(msg.field_2._8_8_ + 8));
    }
  }
  if (this->m_ShaderStages != SHADER_TYPE_UNKNOWN) {
    PVar2 = PipelineTypeFromShaderStages(this->m_ShaderStages);
    this->m_PipelineType = PVar2;
    if (this->m_PipelineType == PIPELINE_TYPE_INVALID) {
      FormatString<char[50]>
                ((string *)&StaticResStages,
                 (char (*) [50])"Failed to deduce pipeline type from shader stages");
      pCVar5 = (Char *)std::__cxx11::string::c_str();
      DebugAssertionFailed
                (pCVar5,"PipelineResourceSignatureBase",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/PipelineResourceSignatureBase.hpp"
                 ,0x18d);
      std::__cxx11::string::~string((string *)&StaticResStages);
    }
  }
  StageBit = SHADER_TYPE_UNKNOWN;
  ShaderTypeInd = this->m_StaticResShaderStages;
  while (SVar1 = StageBit, ShaderTypeInd != 0) {
    msg_1.field_2._12_4_ = ExtractLSB<Diligent::SHADER_TYPE>((SHADER_TYPE *)&ShaderTypeInd);
    msg_1.field_2._8_4_ = GetShaderTypePipelineIndex(msg_1.field_2._12_4_,this->m_PipelineType);
    vVar3 = (value_type_conflict3)StageBit;
    pvVar6 = std::array<signed_char,_6UL>::operator[]
                       (&this->m_StaticResStageIndex,(long)(int)msg_1.field_2._8_4_);
    *pvVar6 = vVar3;
    StageBit = StageBit + SHADER_TYPE_VERTEX;
  }
  SVar4 = GetNumStaticResStages(this);
  if (SVar1 != SVar4) {
    FormatString<char[26],char[45]>
              ((string *)local_98,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"StaticVarStageIdx == GetNumStaticResStages()",
               (char (*) [45])(ulong)SVar4);
    pCVar5 = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (pCVar5,"PipelineResourceSignatureBase",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/PipelineResourceSignatureBase.hpp"
               ,0x198);
    std::__cxx11::string::~string((string *)local_98);
  }
  return;
}

Assistant:

PipelineResourceSignatureBase(IReferenceCounters*                  pRefCounters,
                                  RenderDeviceImplType*                pDevice,
                                  const PipelineResourceSignatureDesc& Desc,
                                  SHADER_TYPE                          ShaderStages      = SHADER_TYPE_UNKNOWN,
                                  bool                                 bIsDeviceInternal = false) :
        TDeviceObjectBase{pRefCounters, pDevice, Desc, bIsDeviceInternal},
        m_ShaderStages{ShaderStages},
        m_SRBMemAllocator{GetRawAllocator()}
    {
        // Don't read from m_Desc until it was allocated and copied in CopyPipelineResourceSignatureDesc()
        this->m_Desc.Resources             = nullptr;
        this->m_Desc.ImmutableSamplers     = nullptr;
        this->m_Desc.CombinedSamplerSuffix = nullptr;

        ValidatePipelineResourceSignatureDesc(Desc, pDevice, EngineImplTraits::DeviceType);

        // Determine shader stages that have any resources as well as
        // shader stages that have static resources.
        for (Uint32 i = 0; i < Desc.NumResources; ++i)
        {
            const PipelineResourceDesc& ResDesc = Desc.Resources[i];

            m_ShaderStages |= ResDesc.ShaderStages;
            if (ResDesc.VarType == SHADER_RESOURCE_VARIABLE_TYPE_STATIC)
                m_StaticResShaderStages |= ResDesc.ShaderStages;
        }

        if (m_ShaderStages != SHADER_TYPE_UNKNOWN)
        {
            m_PipelineType = PipelineTypeFromShaderStages(m_ShaderStages);
            DEV_CHECK_ERR(m_PipelineType != PIPELINE_TYPE_INVALID, "Failed to deduce pipeline type from shader stages");
        }

        {
            Uint32 StaticVarStageIdx = 0;
            for (SHADER_TYPE StaticResStages = m_StaticResShaderStages; StaticResStages != SHADER_TYPE_UNKNOWN; ++StaticVarStageIdx)
            {
                const SHADER_TYPE StageBit           = ExtractLSB(StaticResStages);
                const Int32       ShaderTypeInd      = GetShaderTypePipelineIndex(StageBit, m_PipelineType);
                m_StaticResStageIndex[ShaderTypeInd] = static_cast<Int8>(StaticVarStageIdx);
            }
            VERIFY_EXPR(StaticVarStageIdx == GetNumStaticResStages());
        }
    }